

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsd.cpp
# Opt level: O3

image_char new_image_char(uint xsize,uint ysize)

{
  int *piVar1;
  undefined1 auVar2 [16];
  image_char piVar3;
  uchar *puVar4;
  image_char extraout_RAX;
  image_int piVar5;
  uint extraout_EDX;
  int extraout_EDX_00;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  uint xsize_00;
  undefined4 in_register_0000003c;
  uchar *puVar10;
  uint uVar11;
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  
  puVar10 = (uchar *)CONCAT44(in_register_0000003c,xsize);
  uVar11 = ysize;
  if ((xsize == 0) || (ysize == 0)) {
    new_image_char();
LAB_001041b0:
    new_image_char();
  }
  else {
    puVar10 = (uchar *)0x10;
    piVar3 = (image_char)malloc(0x10);
    if (piVar3 == (image_char)0x0) goto LAB_001041b0;
    puVar10 = (uchar *)(ulong)(ysize * xsize);
    uVar11 = 1;
    puVar4 = (uchar *)calloc((size_t)puVar10,1);
    piVar3->data = puVar4;
    if (puVar4 != (uchar *)0x0) {
      piVar3->xsize = xsize;
      piVar3->ysize = ysize;
      return piVar3;
    }
  }
  new_image_char();
  uVar9 = (uint)puVar10;
  uVar6 = uVar11;
  piVar3 = new_image_char(uVar9,uVar11);
  if ((piVar3 != (image_char)0x0) && (puVar10 = piVar3->data, puVar10 != (uchar *)0x0)) {
    uVar11 = uVar11 * uVar9;
    if (uVar11 != 0) {
      memset(puVar10,extraout_EDX & 0xff,(ulong)uVar11);
    }
    return piVar3;
  }
  new_image_char_ini();
  puVar4 = puVar10;
  if ((puVar10 != (uchar *)0x0) && (puVar4 = *(uchar **)puVar10, puVar4 != (uchar *)0x0)) {
    free(puVar4);
    free(puVar10);
    return extraout_RAX;
  }
  uVar9 = (uint)puVar4;
  free_image_int();
  uVar11 = uVar6;
  if ((uVar9 == 0) || (uVar6 == 0)) {
    xsize_00 = uVar9;
    new_image_int();
  }
  else {
    xsize_00 = 0x10;
    piVar3 = (image_char)malloc(0x10);
    if (piVar3 != (image_char)0x0) {
      xsize_00 = uVar6 * uVar9;
      uVar11 = 4;
      puVar10 = (uchar *)calloc((ulong)xsize_00,4);
      piVar3->data = puVar10;
      if (puVar10 != (uchar *)0x0) {
        piVar3->xsize = uVar9;
        piVar3->ysize = uVar6;
        return piVar3;
      }
      goto LAB_0010427d;
    }
  }
  new_image_int();
LAB_0010427d:
  new_image_int();
  piVar5 = new_image_int(xsize_00,uVar11);
  auVar2 = _DAT_00108030;
  uVar11 = uVar11 * xsize_00;
  if (uVar11 != 0) {
    piVar1 = piVar5->data;
    lVar7 = (ulong)uVar11 - 1;
    auVar12._8_4_ = (int)lVar7;
    auVar12._0_8_ = lVar7;
    auVar12._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar8 = 0;
    auVar12 = auVar12 ^ _DAT_00108030;
    auVar14 = _DAT_00108010;
    auVar15 = _DAT_00108020;
    do {
      auVar16 = auVar15 ^ auVar2;
      iVar13 = auVar12._4_4_;
      if ((bool)(~(auVar16._4_4_ == iVar13 && auVar12._0_4_ < auVar16._0_4_ ||
                  iVar13 < auVar16._4_4_) & 1)) {
        piVar1[uVar8] = extraout_EDX_00;
      }
      if ((auVar16._12_4_ != auVar12._12_4_ || auVar16._8_4_ <= auVar12._8_4_) &&
          auVar16._12_4_ <= auVar12._12_4_) {
        piVar1[uVar8 + 1] = extraout_EDX_00;
      }
      auVar16 = auVar14 ^ auVar2;
      iVar17 = auVar16._4_4_;
      if (iVar17 <= iVar13 && (iVar17 != iVar13 || auVar16._0_4_ <= auVar12._0_4_)) {
        piVar1[uVar8 + 2] = extraout_EDX_00;
        piVar1[uVar8 + 3] = extraout_EDX_00;
      }
      uVar8 = uVar8 + 4;
      lVar7 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 4;
      auVar15._8_8_ = lVar7 + 4;
      lVar7 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 4;
      auVar14._8_8_ = lVar7 + 4;
    } while (((ulong)uVar11 + 3 & 0xfffffffffffffffc) != uVar8);
  }
  return (image_char)piVar5;
}

Assistant:

image_char new_image_char(unsigned int xsize, unsigned int ysize)
{
    image_char image;

    /* check parameters */
    if ( xsize == 0 || ysize == 0 ) error("new_image_char: invalid image size.");

    /* get memory */
    image = (image_char) malloc( sizeof(struct image_char_s) );
    if ( image == NULL ) error("not enough memory.");
    image->data = (unsigned char *) calloc( (size_t) (xsize * ysize),
                                            sizeof(unsigned char) );
    if ( image->data == NULL ) error("not enough memory.");

    /* set image size */
    image->xsize = xsize;
    image->ysize = ysize;

    return image;
}